

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O2

void jessilib::simple_append<char16_t,char>
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *out_string,
               char8_t in_character)

{
  char16_t codepoint;
  
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (out_string,(char *)&codepoint,2);
  return;
}

Assistant:

void simple_append(std::basic_string<ResultCharT>& out_string, char8_t in_character) {
	if constexpr (sizeof(OutCharT) == sizeof(ResultCharT)) {
		out_string += in_character;
	}
	else if constexpr (std::is_same_v<ResultCharT, char>) {
		// Copy in_character into result _as if_ result were of OutCharT
		OutCharT codepoint = in_character;
		// TODO: Assuming native for now, but we need to account for endianness later
		out_string.append(reinterpret_cast<const char*>(&codepoint), sizeof(codepoint));
	}
}